

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::createDFDCompressedTest1_FormatETC2_SR8B8G8_Test::
createDFDCompressedTest1_FormatETC2_SR8B8G8_Test
          (createDFDCompressedTest1_FormatETC2_SR8B8G8_Test *this)

{
  createDFDCompressedTest1 *in_RDI;
  
  createDFDCompressedTest1::createDFDCompressedTest1(in_RDI);
  (in_RDI->super_createDFDTestBaseComp<1U,_8U>).super_createDFDTestBase<1U,_8U>.super_Test.
  _vptr_Test = (_func_int **)&PTR__createDFDCompressedTest1_FormatETC2_SR8B8G8_Test_00218568;
  return;
}

Assistant:

TEST_F(createDFDCompressedTest1, FormatETC2_SR8B8G8) {
    customize(KHR_DF_MODEL_ETC2, KHR_DF_PRIMARIES_BT709,
              KHR_DF_TRANSFER_SRGB, KHR_DF_FLAG_ALPHA_STRAIGHT,
              3, 3,
              {
                {0, 63, KHR_DF_CHANNEL_ETC2_COLOR, 0, 0, 0, 0, 0, 0xFFFFFFFF},
              }
             );

    uint32_t* dfd = createDFDCompressed(c_ETC2_R8G8B8, 4, 4, 1, s_SRGB);

    EXPECT_EQ(*dfd, sizeof(expected) + 4U);
    EXPECT_EQ(memcmp(&expected, dfd+1, sizeof(expected)), 0);

    free(dfd);
}